

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotations_t *
opengv::relative_pose::fivept_kneip
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  const_reference pvVar1;
  vector<int,_std::allocator<int>_> *in_RDX;
  Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *in_RSI;
  DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_> *in_RDI;
  size_t i;
  Matrix<double,_3,_5,_0,_3,_5> f2;
  Matrix<double,_3,_5,_0,_3,_5> f1;
  size_t numberCorrespondences;
  rotations_t *rotations;
  rotations_t *in_stack_00023ea8;
  Matrix<double,_3,_5,_0,_3,_5> *in_stack_00023eb0;
  Matrix<double,_3,_5,_0,_3,_5> *in_stack_00023eb8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe18;
  Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *this;
  Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *in_stack_fffffffffffffe28;
  DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_> *this_00;
  undefined1 local_178 [72];
  undefined1 local_130 [24];
  ulong local_118;
  size_type local_20;
  vector<int,_std::allocator<int>_> *local_18;
  Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> *local_10;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  Eigen::Matrix<double,_3,_5,_0,_3,_5>::Matrix((Matrix<double,_3,_5,_0,_3,_5> *)0xb88bbe);
  Eigen::Matrix<double,_3,_5,_0,_3,_5>::Matrix((Matrix<double,_3,_5,_0,_3,_5> *)0xb88bcb);
  for (local_118 = 0; local_118 < local_20; local_118 = local_118 + 1) {
    this = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_118);
    (*(code *)(this->super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>
              ).super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.
              m_data[2])(local_130,this,(long)*pvVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
              (this_00,(Index)in_stack_fffffffffffffe28);
    Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
              (this,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe28 = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](local_18,local_118);
    (*(code *)(in_stack_fffffffffffffe28->
              super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>).
              super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.
              m_data[3])(local_178,in_stack_fffffffffffffe28,(long)*pvVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>::col
              (this_00,(Index)in_stack_fffffffffffffe28);
    Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>::operator=
              (this,in_stack_fffffffffffffe18);
  }
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0xb88cdd);
  modules::fivept_kneip_main(in_stack_00023eb8,in_stack_00023eb0,in_stack_00023ea8);
  return (rotations_t *)in_RDI;
}

Assistant:

opengv::rotations_t
opengv::relative_pose::fivept_kneip(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 5);

  Eigen::Matrix<double,3,5> f1;
  Eigen::Matrix<double,3,5> f2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    f1.col(i) = adapter.getBearingVector1(indices[i]);
    f2.col(i) = adapter.getBearingVector2(indices[i]);
  }

  rotations_t rotations;
  modules::fivept_kneip_main( f1, f2, rotations );
  return rotations;
}